

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

SymOpnd * __thiscall
Lowerer::GenerateMarkTempAlloc
          (Lowerer *this,RegOpnd *dstOpnd,size_t allocSize,Instr *insertBeforeInstr)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  StackSym *stackSym;
  SymOpnd *src;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  IndirOpnd *dst;
  AddrOpnd *src_00;
  
  if (dstOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6c70,"(dstOpnd)","dstOpnd");
    if (!bVar2) goto LAB_005eb552;
    *puVar3 = 0;
  }
  if (allocSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6c71,"(allocSize != 0)","allocSize != 0");
    if (!bVar2) goto LAB_005eb552;
    *puVar3 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6c72,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) {
LAB_005eb552:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  func = insertBeforeInstr->m_func;
  stackSym = StackSym::New(TyMisc,func);
  Func::StackAllocate(this->m_func,stackSym,(int)allocSize + 8);
  src = IR::SymOpnd::New(&stackSym->super_Sym,8,TyVar,func);
  InsertLea(dstOpnd,&src->super_Opnd,insertBeforeInstr);
  if (this->outerMostLoopLabel == (LabelInstr *)0x0) {
    src_00 = IR::AddrOpnd::NewNull(func);
    dst = IR::IndirOpnd::New(dstOpnd,-8,(src_00->super_Opnd).m_type,this->m_func,false);
    bVar2 = true;
  }
  else {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,HoistMarkTempInitPhase,sourceContextId,functionId);
    if (bVar2) {
      return src;
    }
    dst = (IndirOpnd *)IR::SymOpnd::New(&stackSym->super_Sym,TyUint64,func);
    src_00 = IR::AddrOpnd::NewNull(func);
    insertBeforeInstr = &this->outerMostLoopLabel->super_Instr;
    bVar2 = false;
  }
  InsertMove(&dst->super_Opnd,&src_00->super_Opnd,insertBeforeInstr,bVar2);
  return src;
}

Assistant:

IR::SymOpnd *
Lowerer::GenerateMarkTempAlloc(IR::RegOpnd *const dstOpnd, const size_t allocSize, IR::Instr *const insertBeforeInstr)
{
    Assert(dstOpnd);
    Assert(allocSize != 0);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    // Allocate stack space for the reg exp instance, and a slot for the boxed value
    StackSym *const tempObjectSym = StackSym::New(TyMisc, func);
    m_func->StackAllocate(tempObjectSym, (int)(allocSize + sizeof(void *)));
    IR::SymOpnd * tempObjectOpnd = IR::SymOpnd::New(tempObjectSym, sizeof(void *), TyVar, func);
    InsertLea(dstOpnd, tempObjectOpnd, insertBeforeInstr);

    // Initialize the boxed instance slot
    if (this->outerMostLoopLabel == nullptr)
    {
        GenerateMemInit(dstOpnd, -(int)sizeof(void *), IR::AddrOpnd::NewNull(func), insertBeforeInstr, false);
    }
    else if (!PHASE_OFF(Js::HoistMarkTempInitPhase, this->m_func))
    {
        InsertMove(IR::SymOpnd::New(tempObjectSym, TyMachPtr, func), IR::AddrOpnd::NewNull(func), this->outerMostLoopLabel, false);
    }
    return tempObjectOpnd;
}